

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.c
# Opt level: O0

int main(void)

{
  FILE *pFVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  long local_20;
  size_t opsz;
  int op;
  int s;
  int rc;
  
  s = 0;
  opsz._4_4_ = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/domain.c"
                                ,0x24,1,0x10);
  local_20 = 4;
  op = nn_getsockopt(opsz._4_4_,0,0xc,&opsz,&local_20);
  pFVar1 = _stderr;
  if (op != 0) {
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/domain.c"
            ,0x28);
    fflush(_stderr);
    nn_err_abort();
  }
  if (local_20 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (op)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/domain.c"
            ,0x29);
    fflush(_stderr);
    nn_err_abort();
  }
  if ((int)opsz != 1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","op == AF_SP",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/domain.c"
            ,0x2a);
    fflush(_stderr);
    nn_err_abort();
  }
  local_20 = 4;
  op = nn_getsockopt(opsz._4_4_,0,0xd,&opsz,&local_20);
  pFVar1 = _stderr;
  if (op != 0) {
    piVar2 = __errno_location();
    pcVar3 = nn_err_strerror(*piVar2);
    puVar4 = (uint *)__errno_location();
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/domain.c"
            ,0x2e);
    fflush(_stderr);
    nn_err_abort();
  }
  if (local_20 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","opsz == sizeof (op)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/domain.c"
            ,0x2f);
    fflush(_stderr);
    nn_err_abort();
  }
  if ((int)opsz != 0x10) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","op == NN_PAIR",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/domain.c"
            ,0x30);
    fflush(_stderr);
    nn_err_abort();
  }
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/domain.c"
                  ,0x32,opsz._4_4_);
  return 0;
}

Assistant:

int main ()
{
    int rc;
    int s;
    int op;
    size_t opsz;

    s = test_socket (AF_SP, NN_PAIR);

    opsz = sizeof (op);
    rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_DOMAIN, &op, &opsz);
    errno_assert (rc == 0);
    nn_assert (opsz == sizeof (op));
    nn_assert (op == AF_SP);

    opsz = sizeof (op);
    rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_PROTOCOL, &op, &opsz);
    errno_assert (rc == 0);
    nn_assert (opsz == sizeof (op));
    nn_assert (op == NN_PAIR);

    test_close (s);

    return 0;
}